

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

void Saig_SynchInitRegsTernary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar3 = pAig->nRegs;
  if (0 < iVar3) {
    pVVar2 = pAig->vCis;
    iVar5 = 0;
    do {
      uVar4 = pAig->nTruePis + iVar5;
      if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) {
LAB_006c8497:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar2->pArray[uVar4] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006c8497;
      if (0 < nWords) {
        memset(vSimInfo->pArray[iVar1],0xff,(ulong)(uint)nWords << 2);
        iVar3 = pAig->nRegs;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar3);
  }
  return;
}

Assistant:

void Saig_SynchInitRegsTernary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = 0xffffffff;
    }
}